

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__fill_bits(stbi__zbuf *z)

{
  byte bVar1;
  undefined8 *in_RDI;
  
  do {
    if ((uint)(1 << ((byte)*(undefined4 *)(in_RDI + 2) & 0x1f)) <= *(uint *)((long)in_RDI + 0x14)) {
      *in_RDI = in_RDI[1];
      return;
    }
    bVar1 = stbi__zget8(z);
    *(uint *)((long)in_RDI + 0x14) =
         (uint)bVar1 << ((byte)*(undefined4 *)(in_RDI + 2) & 0x1f) | *(uint *)((long)in_RDI + 0x14);
    *(int *)(in_RDI + 2) = *(int *)(in_RDI + 2) + 8;
  } while (*(int *)(in_RDI + 2) < 0x19);
  return;
}

Assistant:

static void stbi__fill_bits(stbi__zbuf *z)
{
   do {
      if (z->code_buffer >= (1U << z->num_bits)) {
        z->zbuffer = z->zbuffer_end;  /* treat this as EOF so we fail. */
        return;
      }
      z->code_buffer |= (unsigned int) stbi__zget8(z) << z->num_bits;
      z->num_bits += 8;
   } while (z->num_bits <= 24);
}